

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::GetVarTrace(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,char *buf,int buf_size)

{
  strncpy(buf,"vartrace is disabled - use build with SQ_VAR_TRACE_ENABLED=1 option set",
          (long)buf_size);
  buf[(long)buf_size - 1] = '\0';
  return false;
}

Assistant:

bool SQVM::GetVarTrace(const SQObjectPtr &self, const SQObjectPtr &key, char * buf, int buf_size)
{
#if SQ_VAR_TRACE_ENABLED == 1

  SQObjectPtr tmp;
  VarTrace * vt = NULL;
  const char * reason = "";

  if (_ss(this)->_varTraceEnabled == false)
  {
    reason = "vartrace is disabled for this VM";
  }
  else
  {
    switch (sq_type(self))
    {
    case OT_TABLE:
      if (_table(self)->Get(key, tmp))
        vt = _table(self)->GetVarTracePtr(key);
      else
        reason = "key not found";
      break;
    case OT_ARRAY:
      if (sq_isnumeric(key))
      {
        if (_array(self)->Get(tointeger(key), tmp))
          vt = _array(self)->GetVarTracePtr(tointeger(key));
        else
          reason = "index not found";
      }
      break;

    default:
      reason = "not a table or array";
      break;
    }
  }

  if (vt)
  {
    vt->printStack(buf, buf_size);
    return true;
  }
  else
  {
    *buf = 0;
    strncat(buf, reason, buf_size);
    buf[buf_size - 1] = 0;
    return false;
  }

#else

  (void)self;
  (void)key;

  strncpy(buf, "vartrace is disabled - use build with SQ_VAR_TRACE_ENABLED=1 option set", buf_size);
  buf[buf_size-1] = 0;

  return false;

#endif
}